

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

QList<QtGraphicsAnchorLayout::AnchorVertex_*> * __thiscall
QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>::uniqueKeys
          (QList<QtGraphicsAnchorLayout::AnchorVertex_*> *__return_storage_ptr__,
          QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>
          *this)

{
  Span *pSVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  iterator local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (AnchorVertex **)0x0;
  if (this->d !=
      (Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
       *)0x0) {
    local_28 = QHashPrivate::
               Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
               ::begin(this->d);
    while( true ) {
      if (local_28.d ==
          (Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
           *)0x0 && local_28.bucket == 0) break;
      pSVar1 = (local_28.d)->spans;
      uVar2 = local_28.bucket >> 7;
      QList<QtGraphicsAnchorLayout::AnchorVertex_*>::append
                (__return_storage_ptr__,
                 *(parameter_type *)
                  pSVar1[uVar2].entries[pSVar1[uVar2].offsets[(uint)local_28.bucket & 0x7f]].storage
                  .data);
      QHashPrivate::
      iterator<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
      ::operator++(&local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<Key> uniqueKeys() const
    {
        QList<Key> res;
        if (d) {
            auto i = d->begin();
            while (i != d->end()) {
                res.append(i.node()->key);
                ++i;
            }
        }
        return res;
    }